

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void nullifFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  
  iVar1 = sqlite3MemCompare(*argv,argv[1],context->pVdbe->aOp[(long)context->iOp + -1].p4.pColl);
  if (iVar1 != 0) {
    sqlite3VdbeMemCopy(context->pOut,*argv);
    return;
  }
  return;
}

Assistant:

static void nullifFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  CollSeq *pColl = sqlite3GetFuncCollSeq(context);
  UNUSED_PARAMETER(NotUsed);
  if( sqlite3MemCompare(argv[0], argv[1], pColl)!=0 ){
    sqlite3_result_value(context, argv[0]);
  }
}